

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86::forward
          (BinaryOp_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Mat *this_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  bool bVar10;
  uint uVar11;
  float *pfVar12;
  int iVar13;
  Option *opt_00;
  undefined1 (*pauVar14) [16];
  uint uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  pointer b;
  pointer m;
  long lVar19;
  undefined1 (*pauVar20) [16];
  float fVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  __m128 afVar31;
  binary_op_ratan2 op;
  __m128 _b;
  binary_op_ratan2 local_9d;
  int local_9c;
  long local_98;
  long local_90;
  Mat *local_88;
  Mat *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68 [2];
  float afStack_60 [2];
  float local_58 [2];
  float afStack_50 [2];
  undefined1 local_48 [16];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar13 = m[1].h * m[1].w * m[1].d * m[1].c * m[1].elempack;
  if (((m->dims < m[1].dims) && (iVar13 != 1)) || (m->c * m->elempack * m->d * m->h * m->w < iVar13)
     ) {
    uVar11 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3]);
    switch(uVar11) {
    case 1:
      uVar11 = 7;
      break;
    case 3:
      uVar11 = 8;
      break;
    case 6:
      uVar11 = 9;
      break;
    case 7:
      uVar11 = 1;
      break;
    case 8:
      uVar11 = 3;
      break;
    case 9:
      uVar11 = 6;
      break;
    case 10:
      uVar11 = 0xb;
      break;
    case 0xb:
      uVar11 = 10;
    }
    b = m;
    m = m + 1;
  }
  else {
    uVar11 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3]);
    b = m + 1;
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  uVar15 = b->elempack;
  opt_00 = (Option *)(ulong)uVar15;
  uVar1 = b->w;
  iVar13 = b->h;
  iVar18 = b->d;
  iVar17 = b->c;
  if (iVar18 * iVar17 * iVar13 * uVar1 * uVar15 == 1) {
    if (0xb < uVar11) {
      return 0;
    }
    local_78 = *b->data;
    local_48 = ZEXT416((uint)local_78);
    local_88 = this_00;
    local_80 = m;
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    switch(uVar11) {
    case 1:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      lVar19 = 0;
      do {
        pfVar12 = (float *)(m->cstep * lVar19 * m->elemsize + (long)m->data);
        pauVar20 = (undefined1 (*) [16])
                   (this_00->cstep * lVar19 * this_00->elemsize + (long)this_00->data);
        if ((int)uVar11 < 4) {
          uVar15 = 0;
        }
        else {
          iVar18 = 3;
          do {
            auVar25._0_4_ = *pfVar12 - local_78;
            auVar25._4_4_ = pfVar12[1] - local_78;
            auVar25._8_4_ = pfVar12[2] - local_78;
            auVar25._12_4_ = pfVar12[3] - local_78;
            *pauVar20 = auVar25;
            pfVar12 = pfVar12 + 4;
            pauVar20 = pauVar20 + 1;
            iVar18 = iVar18 + 4;
            uVar15 = uVar11 & 0xfffffffc;
          } while (iVar18 < (int)uVar11);
        }
        if (uVar11 - uVar15 != 0 && (int)uVar15 <= (int)uVar11) {
          lVar16 = 0;
          do {
            *(float *)((long)*pauVar20 + lVar16 * 4) = pfVar12[lVar16] - local_78;
            lVar16 = lVar16 + 1;
          } while (uVar11 - uVar15 != (int)lVar16);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != iVar13);
      return 0;
    case 2:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      lVar19 = 0;
      do {
        pfVar12 = (float *)(m->cstep * lVar19 * m->elemsize + (long)m->data);
        pauVar20 = (undefined1 (*) [16])
                   (this_00->cstep * lVar19 * this_00->elemsize + (long)this_00->data);
        if ((int)uVar11 < 4) {
          uVar15 = 0;
        }
        else {
          iVar18 = 3;
          do {
            auVar23._0_4_ = *pfVar12 * local_78;
            auVar23._4_4_ = pfVar12[1] * local_78;
            auVar23._8_4_ = pfVar12[2] * local_78;
            auVar23._12_4_ = pfVar12[3] * local_78;
            *pauVar20 = auVar23;
            pfVar12 = pfVar12 + 4;
            pauVar20 = pauVar20 + 1;
            iVar18 = iVar18 + 4;
            uVar15 = uVar11 & 0xfffffffc;
          } while (iVar18 < (int)uVar11);
        }
        if (uVar11 - uVar15 != 0 && (int)uVar15 <= (int)uVar11) {
          lVar16 = 0;
          do {
            *(float *)((long)*pauVar20 + lVar16 * 4) = pfVar12[lVar16] * local_78;
            lVar16 = lVar16 + 1;
          } while (uVar11 - uVar15 != (int)lVar16);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != iVar13);
      return 0;
    case 3:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      local_78 = 1.0 / local_78;
      lVar19 = 0;
      do {
        pfVar12 = (float *)(m->cstep * lVar19 * m->elemsize + (long)m->data);
        pauVar20 = (undefined1 (*) [16])
                   (this_00->cstep * lVar19 * this_00->elemsize + (long)this_00->data);
        if ((int)uVar11 < 4) {
          uVar15 = 0;
        }
        else {
          iVar18 = 3;
          do {
            auVar27._0_4_ = *pfVar12 * local_78;
            auVar27._4_4_ = pfVar12[1] * local_78;
            auVar27._8_4_ = pfVar12[2] * local_78;
            auVar27._12_4_ = pfVar12[3] * local_78;
            *pauVar20 = auVar27;
            pfVar12 = pfVar12 + 4;
            pauVar20 = pauVar20 + 1;
            iVar18 = iVar18 + 4;
            uVar15 = uVar11 & 0xfffffffc;
          } while (iVar18 < (int)uVar11);
        }
        if (uVar11 - uVar15 != 0 && (int)uVar15 <= (int)uVar11) {
          lVar16 = 0;
          do {
            *(float *)((long)*pauVar20 + lVar16 * 4) = pfVar12[lVar16] * local_78;
            lVar16 = lVar16 + 1;
          } while (uVar11 - uVar15 != (int)lVar16);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != iVar13);
      return 0;
    case 4:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      lVar19 = 0;
      do {
        pauVar20 = (undefined1 (*) [16])(m->cstep * lVar19 * m->elemsize + (long)m->data);
        pauVar14 = (undefined1 (*) [16])
                   (this_00->cstep * lVar19 * this_00->elemsize + (long)this_00->data);
        if ((int)uVar11 < 4) {
          uVar15 = 0;
        }
        else {
          iVar18 = 3;
          do {
            auVar8._4_4_ = local_78;
            auVar8._0_4_ = local_78;
            auVar8._8_4_ = local_78;
            auVar8._12_4_ = local_78;
            auVar26 = maxps(*pauVar20,auVar8);
            *pauVar14 = auVar26;
            pauVar20 = pauVar20 + 1;
            pauVar14 = pauVar14 + 1;
            iVar18 = iVar18 + 4;
            uVar15 = uVar11 & 0xfffffffc;
          } while (iVar18 < (int)uVar11);
        }
        if (uVar11 - uVar15 != 0 && (int)uVar15 <= (int)uVar11) {
          lVar16 = 0;
          do {
            fVar21 = *(float *)(*pauVar20 + lVar16 * 4);
            if (*(float *)(*pauVar20 + lVar16 * 4) <= local_78) {
              fVar21 = local_78;
            }
            *(float *)((long)*pauVar14 + lVar16 * 4) = fVar21;
            lVar16 = lVar16 + 1;
          } while (uVar11 - uVar15 != (int)lVar16);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != iVar13);
      return 0;
    case 5:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      lVar19 = 0;
      do {
        pauVar20 = (undefined1 (*) [16])(m->cstep * lVar19 * m->elemsize + (long)m->data);
        pauVar14 = (undefined1 (*) [16])
                   (this_00->cstep * lVar19 * this_00->elemsize + (long)this_00->data);
        if ((int)uVar11 < 4) {
          uVar15 = 0;
        }
        else {
          iVar18 = 3;
          do {
            auVar7._4_4_ = local_78;
            auVar7._0_4_ = local_78;
            auVar7._8_4_ = local_78;
            auVar7._12_4_ = local_78;
            auVar26 = minps(*pauVar20,auVar7);
            *pauVar14 = auVar26;
            pauVar20 = pauVar20 + 1;
            pauVar14 = pauVar14 + 1;
            iVar18 = iVar18 + 4;
            uVar15 = uVar11 & 0xfffffffc;
          } while (iVar18 < (int)uVar11);
        }
        if (uVar11 - uVar15 != 0 && (int)uVar15 <= (int)uVar11) {
          lVar16 = 0;
          do {
            fVar21 = *(float *)(*pauVar20 + lVar16 * 4);
            if (local_78 <= *(float *)(*pauVar20 + lVar16 * 4)) {
              fVar21 = local_78;
            }
            *(float *)((long)*pauVar14 + lVar16 * 4) = fVar21;
            lVar16 = lVar16 + 1;
          } while (uVar11 - uVar15 != (int)lVar16);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != iVar13);
      return 0;
    case 6:
      local_98 = (long)m->c;
      if (local_98 < 1) {
        return 0;
      }
      local_9c = m->h * m->w * m->d * m->elempack;
      local_90 = 0;
      do {
        pfVar12 = (float *)(local_80->cstep * local_90 * local_80->elemsize + (long)local_80->data);
        pauVar20 = (undefined1 (*) [16])
                   (local_88->cstep * local_90 * local_88->elemsize + (long)local_88->data);
        local_58[1] = fStack_74;
        local_58[0] = local_78;
        afStack_50[1] = fStack_6c;
        afStack_50[0] = fStack_70;
        if (local_9c < 4) {
          iVar13 = 0;
        }
        else {
          iVar18 = 0;
          do {
            local_68 = *(float (*) [2])pfVar12;
            afStack_60 = *(float (*) [2])(pfVar12 + 2);
            afVar31 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                ((binary_op_pow *)&local_9d,(__m128 *)local_68,(__m128 *)local_58);
            auVar6._8_4_ = extraout_XMM0_Dc_01;
            auVar6._0_8_ = afVar31._0_8_;
            auVar6._12_4_ = extraout_XMM0_Dd_01;
            *pauVar20 = auVar6;
            pfVar12 = pfVar12 + 4;
            pauVar20 = pauVar20 + 1;
            iVar13 = iVar18 + 4;
            iVar17 = iVar18 + 7;
            iVar18 = iVar13;
          } while (iVar17 < local_9c);
        }
        iVar18 = local_9c - iVar13;
        if (iVar13 < local_9c) {
          lVar19 = 0;
          do {
            fVar21 = powf(pfVar12[lVar19],local_48._0_4_);
            *(float *)((long)*pauVar20 + lVar19 * 4) = fVar21;
            lVar19 = lVar19 + 1;
          } while (iVar18 != (int)lVar19);
        }
        local_90 = local_90 + 1;
      } while (local_90 != local_98);
      return 0;
    case 7:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      lVar19 = 0;
      do {
        pfVar12 = (float *)(m->cstep * lVar19 * m->elemsize + (long)m->data);
        pauVar20 = (undefined1 (*) [16])
                   (this_00->cstep * lVar19 * this_00->elemsize + (long)this_00->data);
        if ((int)uVar11 < 4) {
          uVar15 = 0;
        }
        else {
          iVar18 = 3;
          do {
            auVar24._0_4_ = local_78 - *pfVar12;
            auVar24._4_4_ = local_78 - pfVar12[1];
            auVar24._8_4_ = local_78 - pfVar12[2];
            auVar24._12_4_ = local_78 - pfVar12[3];
            *pauVar20 = auVar24;
            pfVar12 = pfVar12 + 4;
            pauVar20 = pauVar20 + 1;
            iVar18 = iVar18 + 4;
            uVar15 = uVar11 & 0xfffffffc;
          } while (iVar18 < (int)uVar11);
        }
        if (uVar11 - uVar15 != 0 && (int)uVar15 <= (int)uVar11) {
          lVar16 = 0;
          do {
            *(float *)((long)*pauVar20 + lVar16 * 4) = local_78 - pfVar12[lVar16];
            lVar16 = lVar16 + 1;
          } while (uVar11 - uVar15 != (int)lVar16);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != iVar13);
      return 0;
    case 8:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      lVar19 = 0;
      do {
        pauVar20 = (undefined1 (*) [16])(m->cstep * lVar19 * m->elemsize + (long)m->data);
        pfVar12 = (float *)(this_00->cstep * lVar19 * this_00->elemsize + (long)this_00->data);
        if ((int)uVar11 < 4) {
          uVar15 = 0;
        }
        else {
          iVar18 = 3;
          do {
            auVar26 = *pauVar20;
            in_XMM2 = rcpps(in_XMM2,auVar26);
            fVar21 = local_78 * in_XMM2._0_4_;
            fVar28 = local_78 * in_XMM2._4_4_;
            fVar29 = local_78 * in_XMM2._8_4_;
            fVar30 = local_78 * in_XMM2._12_4_;
            *pfVar12 = (local_78 - auVar26._0_4_ * fVar21) * in_XMM2._0_4_ + fVar21;
            pfVar12[1] = (local_78 - auVar26._4_4_ * fVar28) * in_XMM2._4_4_ + fVar28;
            pfVar12[2] = (local_78 - auVar26._8_4_ * fVar29) * in_XMM2._8_4_ + fVar29;
            pfVar12[3] = (local_78 - auVar26._12_4_ * fVar30) * in_XMM2._12_4_ + fVar30;
            pauVar20 = pauVar20 + 1;
            pfVar12 = pfVar12 + 4;
            iVar18 = iVar18 + 4;
            uVar15 = uVar11 & 0xfffffffc;
          } while (iVar18 < (int)uVar11);
        }
        if (uVar11 - uVar15 != 0 && (int)uVar15 <= (int)uVar11) {
          lVar16 = 0;
          do {
            pfVar12[lVar16] = local_78 / *(float *)(*pauVar20 + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while (uVar11 - uVar15 != (int)lVar16);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != iVar13);
      return 0;
    case 9:
      local_98 = (long)m->c;
      if (local_98 < 1) {
        return 0;
      }
      local_9c = m->h * m->w * m->d * m->elempack;
      local_90 = 0;
      do {
        pfVar12 = (float *)(local_80->cstep * local_90 * local_80->elemsize + (long)local_80->data);
        pauVar20 = (undefined1 (*) [16])
                   (local_88->cstep * local_90 * local_88->elemsize + (long)local_88->data);
        local_58[1] = fStack_74;
        local_58[0] = local_78;
        afStack_50[1] = fStack_6c;
        afStack_50[0] = fStack_70;
        if (local_9c < 4) {
          iVar13 = 0;
        }
        else {
          iVar18 = 0;
          do {
            local_68 = *(float (*) [2])pfVar12;
            afStack_60 = *(float (*) [2])(pfVar12 + 2);
            afVar31 = BinaryOp_x86_functor::binary_op_rpow::func_pack4
                                ((binary_op_rpow *)&local_9d,(__m128 *)local_68,(__m128 *)local_58);
            auVar5._8_4_ = extraout_XMM0_Dc_00;
            auVar5._0_8_ = afVar31._0_8_;
            auVar5._12_4_ = extraout_XMM0_Dd_00;
            *pauVar20 = auVar5;
            pfVar12 = pfVar12 + 4;
            pauVar20 = pauVar20 + 1;
            iVar13 = iVar18 + 4;
            iVar17 = iVar18 + 7;
            iVar18 = iVar13;
          } while (iVar17 < local_9c);
        }
        iVar18 = local_9c - iVar13;
        if (iVar13 < local_9c) {
          lVar19 = 0;
          do {
            fVar21 = powf((float)local_48._0_4_,pfVar12[lVar19]);
            *(float *)((long)*pauVar20 + lVar19 * 4) = fVar21;
            lVar19 = lVar19 + 1;
          } while (iVar18 != (int)lVar19);
        }
        local_90 = local_90 + 1;
      } while (local_90 != local_98);
      return 0;
    case 10:
      local_98 = (long)m->c;
      if (local_98 < 1) {
        return 0;
      }
      local_9c = m->h * m->w * m->d * m->elempack;
      local_90 = 0;
      do {
        pfVar12 = (float *)(local_80->cstep * local_90 * local_80->elemsize + (long)local_80->data);
        pauVar20 = (undefined1 (*) [16])
                   (local_88->cstep * local_90 * local_88->elemsize + (long)local_88->data);
        local_58[1] = fStack_74;
        local_58[0] = local_78;
        afStack_50[1] = fStack_6c;
        afStack_50[0] = fStack_70;
        if (local_9c < 4) {
          iVar13 = 0;
        }
        else {
          iVar18 = 0;
          do {
            local_68 = *(float (*) [2])pfVar12;
            afStack_60 = *(float (*) [2])(pfVar12 + 2);
            afVar31 = BinaryOp_x86_functor::binary_op_atan2::func_pack4
                                ((binary_op_atan2 *)&local_9d,(__m128 *)local_68,(__m128 *)local_58)
            ;
            auVar4._8_4_ = extraout_XMM0_Dc_02;
            auVar4._0_8_ = afVar31._0_8_;
            auVar4._12_4_ = extraout_XMM0_Dd_02;
            *pauVar20 = auVar4;
            pfVar12 = pfVar12 + 4;
            pauVar20 = pauVar20 + 1;
            iVar13 = iVar18 + 4;
            iVar17 = iVar18 + 7;
            iVar18 = iVar13;
          } while (iVar17 < local_9c);
        }
        iVar18 = local_9c - iVar13;
        if (iVar13 < local_9c) {
          lVar19 = 0;
          do {
            fVar21 = atan2f(pfVar12[lVar19],local_48._0_4_);
            *(float *)((long)*pauVar20 + lVar19 * 4) = fVar21;
            lVar19 = lVar19 + 1;
          } while (iVar18 != (int)lVar19);
        }
        local_90 = local_90 + 1;
      } while (local_90 != local_98);
      return 0;
    case 0xb:
      local_98 = (long)m->c;
      if (local_98 < 1) {
        return 0;
      }
      local_9c = m->h * m->w * m->d * m->elempack;
      local_90 = 0;
      do {
        pfVar12 = (float *)(local_80->cstep * local_90 * local_80->elemsize + (long)local_80->data);
        pauVar20 = (undefined1 (*) [16])
                   (local_88->cstep * local_90 * local_88->elemsize + (long)local_88->data);
        local_58[1] = fStack_74;
        local_58[0] = local_78;
        afStack_50[1] = fStack_6c;
        afStack_50[0] = fStack_70;
        if (local_9c < 4) {
          iVar13 = 0;
        }
        else {
          iVar18 = 0;
          do {
            local_68 = *(float (*) [2])pfVar12;
            afStack_60 = *(float (*) [2])(pfVar12 + 2);
            afVar31 = BinaryOp_x86_functor::binary_op_ratan2::func_pack4
                                (&local_9d,(__m128 *)local_68,(__m128 *)local_58);
            auVar26._8_4_ = extraout_XMM0_Dc;
            auVar26._0_8_ = afVar31._0_8_;
            auVar26._12_4_ = extraout_XMM0_Dd;
            *pauVar20 = auVar26;
            pfVar12 = pfVar12 + 4;
            pauVar20 = pauVar20 + 1;
            iVar13 = iVar18 + 4;
            iVar17 = iVar18 + 7;
            iVar18 = iVar13;
          } while (iVar17 < local_9c);
        }
        iVar18 = local_9c - iVar13;
        if (iVar13 < local_9c) {
          lVar19 = 0;
          do {
            fVar21 = atan2f((float)local_48._0_4_,pfVar12[lVar19]);
            *(float *)((long)*pauVar20 + lVar19 * 4) = fVar21;
            lVar19 = lVar19 + 1;
          } while (iVar18 != (int)lVar19);
        }
        local_90 = local_90 + 1;
      } while (local_90 != local_98);
      return 0;
    }
    iVar13 = m->c;
    if ((long)iVar13 < 1) {
      return 0;
    }
    uVar11 = m->h * m->w * m->d * m->elempack;
    lVar19 = 0;
    do {
      pfVar12 = (float *)(m->cstep * lVar19 * m->elemsize + (long)m->data);
      pauVar20 = (undefined1 (*) [16])
                 (this_00->cstep * lVar19 * this_00->elemsize + (long)this_00->data);
      if ((int)uVar11 < 4) {
        uVar15 = 0;
      }
      else {
        iVar18 = 3;
        do {
          auVar22._0_4_ = *pfVar12 + local_78;
          auVar22._4_4_ = pfVar12[1] + local_78;
          auVar22._8_4_ = pfVar12[2] + local_78;
          auVar22._12_4_ = pfVar12[3] + local_78;
          *pauVar20 = auVar22;
          pfVar12 = pfVar12 + 4;
          pauVar20 = pauVar20 + 1;
          iVar18 = iVar18 + 4;
          uVar15 = uVar11 & 0xfffffffc;
        } while (iVar18 < (int)uVar11);
      }
      if (uVar11 - uVar15 != 0 && (int)uVar15 <= (int)uVar11) {
        lVar16 = 0;
        do {
          *(float *)((long)*pauVar20 + lVar16 * 4) = pfVar12[lVar16] + local_78;
          lVar16 = lVar16 + 1;
        } while (uVar11 - uVar15 != (int)lVar16);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != iVar13);
    return 0;
  }
  iVar2 = m->dims;
  iVar3 = b->dims;
  if ((((iVar2 == iVar3) && (m->w == uVar1)) &&
      ((m->h == iVar13 && ((m->d == iVar18 && (m->c == iVar17)))))) && (m->elempack == uVar15)) {
    binary_op_no_broadcast(m,b,this_00,uVar11,opt_00);
    return 0;
  }
  if (iVar3 < iVar2) {
LAB_0037c27b:
    binary_op_broadcast_inner(m,b,this_00,uVar11,opt_00);
    return 0;
  }
  if (iVar2 == 2) {
    if ((uVar1 == 1) && (iVar13 == m->h)) goto LAB_0037c27b;
LAB_0037c2e6:
    bVar10 = false;
LAB_0037c2e9:
    bVar9 = false;
  }
  else {
    if (iVar2 == 4) {
      bVar10 = true;
      if ((uVar1 == 1) &&
         (((iVar13 == 1 &&
           (((iVar18 == 1 && (iVar17 == m->c)) || ((iVar18 == m->d && (iVar17 == m->c)))))) ||
          (((iVar13 == m->h && (iVar18 == m->d)) && (iVar17 == m->c)))))) goto LAB_0037c27b;
      goto LAB_0037c2e9;
    }
    if (iVar2 != 3) goto LAB_0037c2e6;
    bVar9 = true;
    if ((uVar1 == 1) &&
       (((iVar13 == 1 && (iVar17 == m->c)) || ((iVar13 == m->h && (iVar17 == m->c))))))
    goto LAB_0037c27b;
    bVar10 = false;
  }
  if (uVar15 == 1) {
    if (((iVar2 == 2) && (iVar13 == 1)) && (uVar1 == m->w)) {
LAB_0037c360:
      binary_op_broadcast_outer(m,b,this_00,uVar11,opt_00);
      return 0;
    }
    if (bVar9) {
      uVar15 = m->w;
      opt_00 = (Option *)(ulong)uVar15;
      if ((((iVar17 == 1) && (iVar13 == 1)) && (uVar1 == uVar15)) ||
         (((uVar1 == uVar15 && (iVar17 == 1)) && (iVar13 == m->h)))) goto LAB_0037c360;
    }
    if (bVar10) {
      uVar15 = m->w;
      opt_00 = (Option *)(ulong)uVar15;
      if (((((iVar17 == 1) && (iVar18 == 1)) && (iVar13 == 1)) && (uVar1 == uVar15)) ||
         ((uVar1 == uVar15 &&
          ((((iVar17 == 1 && (iVar18 == 1)) && (iVar13 == m->h)) ||
           (((iVar13 == m->h && (iVar17 == 1)) && (iVar18 == m->d)))))))) goto LAB_0037c360;
    }
  }
  if (!bVar9 || iVar3 != 3) {
    return 0;
  }
  if (iVar13 != 1) {
    return 0;
  }
  if (m->w != uVar1) {
    return 0;
  }
  if (m->c != iVar17) {
    return 0;
  }
  binary_op_broadcast_20(m,b,this_00,uVar11,opt_00);
  return 0;
}

Assistant:

__m256 func_pack8(const __m256& x, const __m256& y) const
    {
        return atan2256_ps(x, y);
    }